

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission_parse.cpp
# Opt level: O2

bool __thiscall FIntermissionActionFader::ParseKey(FIntermissionActionFader *this,FScanner *sc)

{
  bool bVar1;
  int iVar2;
  FadeType FT [3];
  
  FT[2].Name = (char *)0x0;
  FT[2].Type = FADE_In;
  FT[2]._12_4_ = 0;
  FT[1].Name = "FadeOut";
  FT[1].Type = FADE_Out;
  FT[1]._12_4_ = 0;
  FT[0].Name = "FadeIn";
  FT[0].Type = FADE_In;
  FT[0]._12_4_ = 0;
  bVar1 = FScanner::Compare(sc,"FadeType");
  if (bVar1) {
    FScanner::MustGetToken(sc,0x3d);
    FScanner::MustGetToken(sc,0x101);
    iVar2 = FScanner::MatchString(sc,&FT[0].Name,0x10);
    if (iVar2 != -1) {
      this->mFadeType = FT[iVar2].Type;
    }
    return true;
  }
  bVar1 = FIntermissionAction::ParseKey(&this->super_FIntermissionAction,sc);
  return bVar1;
}

Assistant:

bool FIntermissionActionFader::ParseKey(FScanner &sc)
{
	struct FadeType
	{
		const char *Name;
		EFadeType Type;
	}
	const FT[] = {
		{ "FadeIn", FADE_In },
		{ "FadeOut", FADE_Out },
		{ NULL, FADE_In }
	};

	if (sc.Compare("FadeType"))
	{
		sc.MustGetToken('=');
		sc.MustGetToken(TK_Identifier);
		int v = sc.MatchString(&FT[0].Name, sizeof(FT[0]));
		if (v != -1) mFadeType = FT[v].Type;
		return true;
	}
	else return Super::ParseKey(sc);
}